

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemb_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1103bec::DropoutTest_KeepsLargeCoeffs_Test::TestBody
          (DropoutTest_KeepsLargeCoeffs_Test *this)

{
  initializer_list<int> __l;
  tran_low_t qcoeff_scan [32];
  uint32_t dropout_num_after;
  uint32_t dropout_num_before;
  TX_SIZE tx_size;
  tran_low_t *in_stack_0002d5f0;
  int in_stack_0002d5fc;
  int in_stack_0002d600;
  TX_TYPE in_stack_0002d606;
  TX_SIZE in_stack_0002d607;
  vector<int,_std::allocator<int>_> *this_00;
  allocator_type *in_stack_fffffffffffffea8;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffeb0;
  iterator piVar1;
  size_type sVar2;
  vector<int,_std::allocator<int>_> *expected;
  tran_low_t *actual;
  
  this_00 = (vector<int,_std::allocator<int>_> *)0x0;
  Dropout(in_stack_0002d607,in_stack_0002d606,in_stack_0002d600,in_stack_0002d5fc,in_stack_0002d5f0)
  ;
  expected = (vector<int,_std::allocator<int>_> *)0x0;
  actual = (tran_low_t *)0x0;
  piVar1 = (iterator)0x0;
  sVar2 = 0;
  std::allocator<int>::allocator((allocator<int> *)0xae5c58);
  __l._M_len = sVar2;
  __l._M_array = piVar1;
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_fffffffffffffeb0,__l,in_stack_fffffffffffffea8);
  ExpectArrayEq(actual,expected);
  std::vector<int,_std::allocator<int>_>::~vector(this_00);
  std::allocator<int>::~allocator((allocator<int> *)0xae5ca7);
  return;
}

Assistant:

TEST(DropoutTest, KeepsLargeCoeffs) {
  const TX_SIZE tx_size = TX_8X4;
  const uint32_t dropout_num_before = 4;
  const uint32_t dropout_num_after = 6;
  // Large isolated coeffs should be preserved.
  tran_low_t qcoeff_scan[] = { 0, 0, 0, 0, 0, 0, 42, 0,    // should be kept
                               0, 0, 0, 0, 0, 0, 0,  0,    //
                               0, 0, 0, 0, 0, 0, 0,  -30,  // should be kept
                               0, 0, 0, 0, 0, 0, 0,  0 };
  Dropout(tx_size, kTxType, dropout_num_before, dropout_num_after, qcoeff_scan);
  ExpectArrayEq(qcoeff_scan, { 0, 0, 0, 0, 0, 0, 42, 0,    //
                               0, 0, 0, 0, 0, 0, 0,  0,    //
                               0, 0, 0, 0, 0, 0, 0,  -30,  //
                               0, 0, 0, 0, 0, 0, 0,  0 });
}